

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O0

utf8proc_bool
utf8proc_grapheme_break_stateful(utf8proc_int32_t c1,utf8proc_int32_t c2,utf8proc_int32_t *state)

{
  ushort uVar1;
  utf8proc_bool uVar2;
  utf8proc_property_t *puVar3;
  utf8proc_int32_t *state_local;
  utf8proc_int32_t c2_local;
  utf8proc_int32_t c1_local;
  
  puVar3 = utf8proc_get_property(c1);
  uVar1 = *(ushort *)&puVar3->field_0x14;
  puVar3 = utf8proc_get_property(c2);
  uVar2 = grapheme_break_extended
                    ((uint)(uVar1 >> 8),(uint)(*(ushort *)&puVar3->field_0x14 >> 8),state);
  return uVar2;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_bool utf8proc_grapheme_break_stateful(
    utf8proc_int32_t c1, utf8proc_int32_t c2, utf8proc_int32_t *state) {

  return grapheme_break_extended(utf8proc_get_property(c1)->boundclass,
                                 utf8proc_get_property(c2)->boundclass,
                                 state);
}